

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvdir.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  long *plVar4;
  uint s_00;
  int local_110;
  char local_109;
  int i;
  char ch;
  taia stampcheck;
  taia now;
  taia deadline;
  int pid;
  int curdir;
  int wstat;
  time_t mtime;
  stat s;
  char **argv_local;
  int argc_local;
  
  _curdir = 0;
  s.__glibc_reserved[2] = (__syscall_slong_t)(argv + 1);
  progname = *argv;
  if (((char **)s.__glibc_reserved[2] == (char **)0x0) ||
     (*(char **)s.__glibc_reserved[2] == (char *)0x0)) {
    usage();
  }
  if (**(char **)s.__glibc_reserved[2] != '-') goto LAB_00102a75;
  if (*(char *)(*(long *)s.__glibc_reserved[2] + 1) == '-') {
LAB_00102a51:
    s.__glibc_reserved[2] = s.__glibc_reserved[2] + 8;
  }
  else if (*(char *)(*(long *)s.__glibc_reserved[2] + 1) == 'P') {
    pgrp = 1;
    goto LAB_00102a51;
  }
  if ((s.__glibc_reserved[2] == 0) || (*(long *)s.__glibc_reserved[2] == 0)) {
    usage();
  }
LAB_00102a75:
  sig_catch(sig_term,s_term);
  sig_catch(sig_hangup,s_hangup);
  plVar4 = (long *)(s.__glibc_reserved[2] + 8);
  svdir = *(char **)s.__glibc_reserved[2];
  s.__glibc_reserved[2] = (__syscall_slong_t)plVar4;
  if ((plVar4 != (long *)0x0) && (*plVar4 != 0)) {
    rplog = (char *)*plVar4;
    iVar1 = setup_log();
    if (iVar1 != 1) {
      rplog = (char *)0x0;
      warn3x("log service disabled.",(char *)0x0,(char *)0x0);
    }
  }
  iVar1 = open_read(".");
  if (iVar1 == -1) {
    fatal("unable to open current directory",(char *)0x0);
  }
  coe(iVar1);
  taia_now((taia *)&i);
  do {
    while (iVar2 = wait_nohang(&pid), iVar2 < 1) {
      taia_now((taia *)&stampcheck.atto);
      if (stampcheck.atto < _i - 3) {
        warn3x("time warp: resetting time stamp.",(char *)0x0,(char *)0x0);
        taia_now((taia *)&i);
        taia_now((taia *)&stampcheck.atto);
        if (rplog != (char *)0x0) {
          taia_now(&stamplog);
        }
      }
      iVar2 = taia_less((taia *)&stampcheck.atto,(taia *)&i);
      if (iVar2 == 0) {
        taia_uint((taia *)&now.atto,1);
        taia_add((taia *)&i,(taia *)&stampcheck.atto,(taia *)&now.atto);
        iVar2 = stat(svdir,(stat *)&mtime);
        if (iVar2 == -1) {
          warn("unable to stat ",svdir);
        }
        else if ((((check != 0) || (s.st_atim.tv_nsec != _curdir)) || (s.st_dev != ino)) ||
                (mtime != dev)) {
          iVar2 = chdir(svdir);
          if (iVar2 == -1) {
            warn("unable to change directory to ",svdir);
          }
          else {
            _curdir = s.st_atim.tv_nsec;
            dev = mtime;
            ino = s.st_dev;
            check = 0;
            if (stampcheck.atto <= s.st_atim.tv_nsec + 0x400000000000000aU) {
              sleep(1);
            }
            runsvdir();
            while (iVar2 = fchdir(iVar1), iVar2 == -1) {
              warn("unable to change directory, pausing",(char *)0x0);
              sleep(5);
            }
          }
        }
      }
      if ((rplog != (char *)0x0) &&
         (iVar2 = taia_less((taia *)&stampcheck.atto,&stamplog), iVar2 == 0)) {
        write(logpipe[1],".",1);
        taia_uint((taia *)&now.atto,900);
        taia_add(&stamplog,(taia *)&stampcheck.atto,(taia *)&now.atto);
      }
      s_00 = 5;
      if (check != 0) {
        s_00 = 1;
      }
      taia_uint((taia *)&now.atto,s_00);
      taia_add((taia *)&now.atto,(taia *)&stampcheck.atto,(taia *)&now.atto);
      sig_block(sig_child);
      if (rplog == (char *)0x0) {
        iopause((iopause_fd *)0x0,0,(taia *)&now.atto,(taia *)&stampcheck.atto);
      }
      else {
        iopause(io,1,(taia *)&now.atto,(taia *)&stampcheck.atto);
      }
      sig_unblock(sig_child);
      if ((rplog != (char *)0x0) && ((ushort)(io[0].revents | 1U) != 0)) {
        while (sVar3 = read(logpipe[0],&local_109,1), 0 < sVar3) {
          if (local_109 != '\0') {
            for (local_110 = 6; local_110 < rploglen; local_110 = local_110 + 1) {
              rplog[local_110 + -1] = rplog[local_110];
            }
            rplog[rploglen + -1] = local_109;
          }
        }
      }
      if (exitsoon == 1) {
        _exit(0);
      }
      if (exitsoon == 2) {
        for (local_110 = 0; local_110 < svnum; local_110 = local_110 + 1) {
          if (sv[local_110].pid != 0) {
            kill(sv[local_110].pid,0xf);
          }
        }
        _exit(0x6f);
      }
    }
    for (local_110 = 0; local_110 < svnum; local_110 = local_110 + 1) {
      if (iVar2 == sv[local_110].pid) {
        sv[local_110].pid = 0;
        check = 1;
        break;
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  struct stat s;
  time_t mtime =0;
  int wstat;
  int curdir;
  int pid;
  struct taia deadline;
  struct taia now;
  struct taia stampcheck;
  char ch;
  int i;

  progname =*argv++;
  if (! argv || ! *argv) usage();
  if (**argv == '-') {
    switch (*(*argv +1)) {
    case 'P': pgrp =1;
    case '-': ++argv;
    }
    if (! argv || ! *argv) usage();
  }

  sig_catch(sig_term, s_term);
  sig_catch(sig_hangup, s_hangup);
  svdir =*argv++;
  if (argv && *argv) {
    rplog =*argv;
    if (setup_log() != 1) {
      rplog =0;
      warn3x("log service disabled.", 0, 0);
    }
  }
  if ((curdir =open_read(".")) == -1)
    fatal("unable to open current directory", 0);
  coe(curdir);

  taia_now(&stampcheck);

  for (;;) {
    /* collect children */
    for (;;) {
      if ((pid =wait_nohang(&wstat)) <= 0) break;
      for (i =0; i < svnum; i++) {
        if (pid == sv[i].pid) {
          /* runsv has gone */
          sv[i].pid =0;
          check =1;
          break;
        }
      }
    }

    taia_now(&now);
    if (now.sec.x < (stampcheck.sec.x -3)) {
      /* time warp */
      warn3x("time warp: resetting time stamp.", 0, 0);
      taia_now(&stampcheck);
      taia_now(&now);
      if (rplog) taia_now(&stamplog);
    }
    if (taia_less(&now, &stampcheck) == 0) {
      /* wait at least a second */
      taia_uint(&deadline, 1);
      taia_add(&stampcheck, &now, &deadline);

      if (stat(svdir, &s) != -1) {
        if (check || \
            s.st_mtime != mtime || s.st_ino != ino || s.st_dev != dev) {
          /* svdir modified */
          if (chdir(svdir) != -1) {
            mtime =s.st_mtime;
            dev =s.st_dev;
            ino =s.st_ino;
            check =0;
            if (now.sec.x <= (4611686018427387914ULL +(uint64)mtime))
              sleep(1);
            runsvdir();
            while (fchdir(curdir) == -1) {
              warn("unable to change directory, pausing", 0);
              sleep(5);
            }
          }
          else
            warn("unable to change directory to ", svdir);
        }
      }
      else
        warn("unable to stat ", svdir);
    }

    if (rplog)
      if (taia_less(&now, &stamplog) == 0) {
        write(logpipe[1], ".", 1);
        taia_uint(&deadline, 900);
        taia_add(&stamplog, &now, &deadline);
      }
    taia_uint(&deadline, check ? 1 : 5);
    taia_add(&deadline, &now, &deadline);

    sig_block(sig_child);
    if (rplog)
      iopause(io, 1, &deadline, &now);
    else
      iopause(0, 0, &deadline, &now);
    sig_unblock(sig_child);

    if (rplog && (io[0].revents | IOPAUSE_READ))
      while (read(logpipe[0], &ch, 1) > 0)
        if (ch) {
          for (i =6; i < rploglen; i++)
            rplog[i -1] =rplog[i];
          rplog[rploglen -1] =ch;
        }

    switch(exitsoon) {
    case 1:
      _exit(0);
    case 2:
      for (i =0; i < svnum; i++) if (sv[i].pid) kill(sv[i].pid, SIGTERM);
      _exit(111);
    }
  }
  /* not reached */
  _exit(0);
}